

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

void jinit_d_coef_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  jpeg_error_mgr *pjVar1;
  jpeg_d_coef_controller *pjVar2;
  void *__s;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  pjVar2 = (jpeg_d_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x88);
  cinfo->coef = pjVar2;
  pjVar2->start_input_pass = start_input_pass;
  pjVar2->start_output_pass = start_output_pass;
  if (need_full_buffer != 0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x31;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
    return;
  }
  __s = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
  lVar4 = 0;
  lVar5 = 1;
  lVar3 = 0;
  auVar6._8_4_ = (int)__s;
  auVar6._0_8_ = __s;
  auVar6._12_4_ = (int)((ulong)__s >> 0x20);
  do {
    (&pjVar2[1].start_output_pass)[lVar3] =
         (_func_void_j_decompress_ptr *)(lVar4 * 0x80 + (long)__s);
    (&pjVar2[1].start_output_pass + lVar3)[1] =
         (_func_void_j_decompress_ptr *)(lVar5 * 0x80 + auVar6._8_8_);
    lVar3 = lVar3 + 2;
    lVar4 = lVar4 + 2;
    lVar5 = lVar5 + 2;
  } while (lVar3 != 10);
  if (cinfo->lim_Se == 0) {
    memset(__s,0,0x500);
  }
  pjVar2->consume_data = dummy_consume_data;
  pjVar2->decompress_data = decompress_onepass;
  pjVar2->coef_arrays = (jvirt_barray_ptr *)0x0;
  return;
}

Assistant:

GLOBAL(void)
jinit_d_coef_controller (j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_coef_controller));
  cinfo->coef = (struct jpeg_d_coef_controller *) coef;
  coef->pub.start_input_pass = start_input_pass;
  coef->pub.start_output_pass = start_output_pass;
#ifdef BLOCK_SMOOTHING_SUPPORTED
  coef->coef_bits_latch = NULL;
#endif

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    /* Note we ask for a pre-zeroed array. */
    int ci, access_rows;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      access_rows = compptr->v_samp_factor;
#ifdef BLOCK_SMOOTHING_SUPPORTED
      /* If block smoothing could be used, need a bigger window */
      if (cinfo->progressive_mode)
	access_rows *= 3;
#endif
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, TRUE,
	 (JDIMENSION) jround_up((long) compptr->width_in_blocks,
				(long) compptr->h_samp_factor),
	 (JDIMENSION) jround_up((long) compptr->height_in_blocks,
				(long) compptr->v_samp_factor),
	 (JDIMENSION) access_rows);
    }
    coef->pub.consume_data = consume_data;
    coef->pub.decompress_data = decompress_data;
    coef->pub.coef_arrays = coef->whole_image; /* link to virtual arrays */
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  D_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK));
    for (i = 0; i < D_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    if (cinfo->lim_Se == 0)	/* DC only case: want to bypass later */
      FMEMZERO((void FAR *) buffer,
	       (size_t) (D_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK)));
    coef->pub.consume_data = dummy_consume_data;
    coef->pub.decompress_data = decompress_onepass;
    coef->pub.coef_arrays = NULL; /* flag for no virtual arrays */
  }
}